

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffTable(NodeDiffComputer *this,TableDecl *lhs,TableDecl *rhs)

{
  TableMember *pTVar1;
  TableMember *pTVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int local_48;
  int32_t local_44;
  
  iVar4 = (lhs->_members)._size - (rhs->_members)._size;
  if (iVar4 == 0) {
    if ((lhs->_members)._size == 0) {
      local_48 = 0;
    }
    else {
      uVar8 = 0;
      lVar9 = 0x10;
      local_48 = 0;
      do {
        pTVar1 = (lhs->_members)._vals;
        pTVar2 = (rhs->_members)._vals;
        iVar5 = diffNodes(this,*(Node **)((long)pTVar1 + lVar9 + -0x10),
                          *(Node **)((long)pTVar2 + lVar9 + -0x10));
        if (this->limit < iVar5) {
          bVar3 = false;
          iVar6 = iVar5;
        }
        else {
          iVar6 = diffNodes(this,*(Node **)((long)pTVar1 + lVar9 + -8),
                            *(Node **)((long)pTVar2 + lVar9 + -8));
          bVar3 = iVar6 <= this->limit;
          if (iVar6 <= this->limit) {
            iVar4 = 0;
            if (((*(byte *)((long)&pTVar1->key + lVar9) ^ *(byte *)((long)&pTVar2->key + lVar9)) & 1
                ) != 0) {
              iVar4 = (this->DiffCosts).StaticMemberDiffCost;
            }
            local_48 = iVar5 + local_48 + iVar6 + iVar4;
            bVar3 = true;
            iVar6 = local_44;
          }
        }
        local_44 = iVar6;
        if (!bVar3) {
          return local_44;
        }
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar8 < (lhs->_members)._size);
    }
  }
  else {
    iVar7 = -iVar4;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
    local_48 = iVar7 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return local_48;
}

Assistant:

int32_t diffTable(const TableDecl *lhs, const TableDecl *rhs) {
    const auto &leftMembers = lhs->members();
    const auto &rightMembers = rhs->members();

    if (leftMembers.size() != rightMembers.size())
      return sizeDiff(leftMembers.size(), rightMembers.size());

    int32_t tableDiff = 0;

    for (int32_t i = 0; i < leftMembers.size(); ++i) {
      const auto &l = leftMembers[i];
      const auto &r = rightMembers[i];

      int32_t keyDiff = diffNodes(l.key, r.key);

      if (keyDiff > limit)
        return keyDiff;

      int32_t valueDiff = diffNodes(l.value, r.value);

      if (valueDiff > limit)
        return valueDiff;

      tableDiff += (keyDiff + valueDiff);

      if (l.isStatic() != r.isStatic())
        tableDiff += DiffCosts.StaticMemberDiffCost;
    }

    return tableDiff;
  }